

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton button,float lock_threshold)

{
  ImVec2 *mouse_pos;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImVec2 *mouse_pos_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ImVec2 IVar5;
  
  pIVar1 = GImGui;
  if ((uint)button < 5) {
    if (lock_threshold < 0.0) {
      lock_threshold = (GImGui->IO).MouseDragThreshold;
    }
    if ((((GImGui->IO).MouseDown[(uint)button] != false) ||
        (IVar5.x = 0.0, IVar5.y = 0.0, (GImGui->IO).MouseReleased[(uint)button] == true)) &&
       (IVar5.x = 0.0, IVar5.y = 0.0,
       lock_threshold * lock_threshold <= (GImGui->IO).MouseDragMaxDistanceSqr[(uint)button])) {
      mouse_pos = &(GImGui->IO).MousePos;
      bVar2 = IsMousePosValid(mouse_pos);
      if (bVar2) {
        mouse_pos_00 = (pIVar1->IO).MouseClickedPos + (uint)button;
        bVar2 = IsMousePosValid(mouse_pos_00);
        IVar5.x = 0.0;
        IVar5.y = 0.0;
        if (bVar2) {
          auVar3._8_8_ = 0;
          auVar3._0_4_ = mouse_pos->x;
          auVar3._4_4_ = mouse_pos->y;
          auVar4._8_8_ = 0;
          auVar4._0_4_ = mouse_pos_00->x;
          auVar4._4_4_ = mouse_pos_00->y;
          auVar3 = vsubps_avx(auVar3,auVar4);
          IVar5 = auVar3._0_8_;
        }
      }
      else {
        IVar5.x = 0.0;
        IVar5.y = 0.0;
      }
    }
    return IVar5;
  }
  __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0x1277,"ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton, float)");
}

Assistant:

ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (lock_threshold < 0.0f)
        lock_threshold = g.IO.MouseDragThreshold;
    if (g.IO.MouseDown[button] || g.IO.MouseReleased[button])
        if (g.IO.MouseDragMaxDistanceSqr[button] >= lock_threshold * lock_threshold)
            if (IsMousePosValid(&g.IO.MousePos) && IsMousePosValid(&g.IO.MouseClickedPos[button]))
                return g.IO.MousePos - g.IO.MouseClickedPos[button];
    return ImVec2(0.0f, 0.0f);
}